

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O2

void dumpData<int>(Serializer *serializer,DataFieldInfo *info,Savepoint *savepoint,Bounds *iBounds,
                  Bounds *jBounds,Bounds *kBounds,Bounds *lBounds)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int l;
  ulong uVar15;
  int *data;
  int local_88;
  int local_7c;
  int *local_38;
  
  readData<int>(serializer,info,savepoint,&local_38);
  iVar14 = iBounds->lower;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  iVar10 = info->iSize_ + -1;
  if (iBounds->upper < iVar10) {
    iVar10 = iBounds->upper;
  }
  iVar1 = info->jSize_;
  iVar13 = jBounds->lower;
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  iVar11 = iVar1 + -1;
  if (jBounds->upper < iVar1 + -1) {
    iVar11 = jBounds->upper;
  }
  iVar2 = info->kSize_;
  uVar4 = kBounds->lower;
  if (kBounds->lower < 1) {
    uVar4 = 0;
  }
  iVar5 = iVar2 + -1;
  if (kBounds->upper < iVar2 + -1) {
    iVar5 = kBounds->upper;
  }
  iVar3 = info->lSize_;
  uVar6 = 0;
  if (0 < lBounds->lower) {
    uVar6 = lBounds->lower;
  }
  iVar7 = iVar3 + -1;
  if (lBounds->upper < iVar3 + -1) {
    iVar7 = lBounds->upper;
  }
  iVar8 = ((iVar1 * iVar14 + iVar13) * iVar2 + uVar4) * iVar3;
  while( true ) {
    iVar12 = iVar13;
    local_88 = iVar8;
    if (iVar10 < iVar14) break;
    for (; iVar12 <= iVar11; iVar12 = iVar12 + 1) {
      if (1 < iVar2) {
        std::operator<<((ostream *)&std::cout,"[ ");
      }
      local_7c = local_88;
      for (uVar9 = (ulong)uVar4; (long)uVar9 <= (long)iVar5; uVar9 = uVar9 + 1) {
        if (1 < iVar3) {
          std::operator<<((ostream *)&std::cout,"( ");
        }
        for (uVar15 = (ulong)uVar6; (long)uVar15 <= (long)iVar7; uVar15 = uVar15 + 1) {
          std::ostream::operator<<(&std::cout,local_38[(long)local_7c + uVar15]);
          if ((long)uVar15 < (long)iVar7) {
            std::operator<<((ostream *)&std::cout,", ");
          }
        }
        if (1 < iVar3) {
          std::operator<<((ostream *)&std::cout," )");
        }
        if ((long)uVar9 < (long)iVar5) {
          std::operator<<((ostream *)&std::cout,", ");
        }
        local_7c = local_7c + iVar3;
      }
      if (1 < iVar2) {
        std::operator<<((ostream *)&std::cout," ]");
      }
      if (iVar12 < iVar11) {
        std::operator<<((ostream *)&std::cout,", ");
      }
      local_88 = local_88 + iVar2 * iVar3;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar14 = iVar14 + 1;
    iVar8 = iVar8 + iVar1 * iVar2 * iVar3;
  }
  return;
}

Assistant:

void dumpData(const Serializer& serializer, const DataFieldInfo& info, const Savepoint& savepoint,
              const Bounds& iBounds, const Bounds& jBounds, const Bounds& kBounds, const Bounds& lBounds)
{
	T* data;
	readData(serializer, info, savepoint, data);

	int iSize = info.iSize();
	int iLower = std::max(0, iBounds.lower);
	int iUpper = std::min(iSize - 1, iBounds.upper);
	int jSize = info.jSize();
	int jLower = std::max(0, jBounds.lower);
	int jUpper = std::min(jSize - 1, jBounds.upper);
	int kSize = info.kSize();
	int kLower = std::max(0, kBounds.lower);
	int kUpper = std::min(kSize - 1, kBounds.upper);
	int lSize = info.lSize();
	int lLower = std::max(0, lBounds.lower);
	int lUpper = std::min(lSize - 1, lBounds.upper);

	for (int i = iLower; i <= iUpper; ++i)
	{
		for (int j = jLower; j <= jUpper; ++j)
		{
			if (kSize > 1) std::cout << "[ ";
			for (int k = kLower; k <= kUpper; ++k)
			{
				if (lSize > 1) std::cout << "( ";
				for (int l = lLower; l <= lUpper; ++l)
				{
					int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;
					std::cout << data[index];
					if (l < lUpper) std::cout << ", ";
				}
				if (lSize > 1) std::cout << " )";
				if (k < kUpper) std::cout << ", ";
			}
			if (kSize > 1) std::cout << " ]";
			if (j < jUpper) std::cout << ", ";
		}
		std::cout << std::endl;
	}
}